

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::findOrInsert<ProKey>
          (InsertionResult *__return_storage_ptr__,
          Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *this,ProKey *key)

{
  Span *pSVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  Bucket BVar6;
  size_t *local_38;
  
  uVar4 = this->seed;
  sVar3 = qHash(&key->super_ProString);
  uVar4 = sVar3 ^ uVar4;
  if (this->numBuckets == 0) {
    uVar5 = this->size;
LAB_0028a0af:
    rehash(this,uVar5 + 1);
    BVar6 = findBucketWithHash<ProKey>(this,key,uVar4);
  }
  else {
    BVar6 = findBucketWithHash<ProKey>(this,key,uVar4);
    bVar2 = true;
    if ((BVar6.span)->offsets[BVar6.index] != 0xff) goto LAB_0028a0e2;
    uVar5 = this->size;
    if (this->numBuckets >> 1 <= uVar5) goto LAB_0028a0af;
  }
  local_38 = &this->size;
  Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::insert(BVar6.span,BVar6.index);
  *local_38 = *local_38 + 1;
  bVar2 = false;
LAB_0028a0e2:
  pSVar1 = this->spans;
  (__return_storage_ptr__->it).d = this;
  (__return_storage_ptr__->it).bucket =
       ((ulong)((long)BVar6.span - (long)pSVar1) >> 4) * 0x1c71c71c71c71c80 | BVar6.index;
  __return_storage_ptr__->initialized = bVar2;
  return __return_storage_ptr__;
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }